

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_varnode.cc
# Opt level: O1

bool __thiscall
Funcdata::ancestorOpUse(Funcdata *this,int4 maxlevel,Varnode *invn,PcodeOp *op,ParamTrial *trial)

{
  uint uVar1;
  OpCode OVar2;
  PcodeOp *pPVar3;
  Varnode *pVVar4;
  bool bVar5;
  pointer ppVVar6;
  long lVar7;
  
  while( true ) {
    if (maxlevel == 0) {
      return false;
    }
    uVar1 = invn->flags;
    if ((uVar1 & 0x10) == 0) break;
    pPVar3 = invn->def;
    OVar2 = pPVar3->opcode->opcode;
    switch(OVar2) {
    case CPUI_INDIRECT:
      if ((pPVar3->flags & 0x8000000) != 0) {
        return false;
      }
    case CPUI_MULTIEQUAL:
      ppVVar6 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(pPVar3->inrefs).
                              super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)ppVVar6) >> 3) < 1) {
        return false;
      }
      lVar7 = 0;
      do {
        bVar5 = ancestorOpUse(this,maxlevel + -1,ppVVar6[lVar7],op,trial);
        if (bVar5) {
          return bVar5;
        }
        lVar7 = lVar7 + 1;
        ppVVar6 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
      } while (lVar7 < (int)((ulong)((long)(pPVar3->inrefs).
                                           super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppVVar6) >> 3));
      return bVar5;
    case CPUI_PIECE:
      maxlevel = maxlevel + -1;
      invn = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start[1];
      break;
    case CPUI_SUBPIECE:
      ppVVar6 = (pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((((ppVVar6[1]->loc).offset == 0) && (pVVar4 = *ppVVar6, (pVVar4->flags & 0x10) != 0)) &&
         (pVVar4->def->opcode->opcode - CPUI_INT_REM < 2)) {
        *(byte *)&trial->flags = (byte)trial->flags | 0x40;
      }
      goto LAB_0029e4a0;
    default:
      if (OVar2 != CPUI_COPY) {
        if (OVar2 - CPUI_CALL < 2) {
          return false;
        }
        goto LAB_0029e4a0;
      }
      if (((uVar1 >> 0x15 & 1) == 0) && (((invn->loc).base)->type != IPTR_INTERNAL))
      goto LAB_0029e4a0;
      maxlevel = maxlevel + -1;
      invn = *(pPVar3->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    }
  }
  if ((~uVar1 & 0x108) != 0) {
    return false;
  }
LAB_0029e4a0:
  bVar5 = onlyOpUse(this,invn,op,trial);
  return bVar5;
}

Assistant:

bool Funcdata::ancestorOpUse(int4 maxlevel,const Varnode *invn,
			     const PcodeOp *op,ParamTrial &trial) const

{
  int4 i;

  if (maxlevel==0) return false;

  if (!invn->isWritten()) {
    if (!invn->isInput()) return false;
    if (!invn->isTypeLock()) return false;
				// If the input is typelocked
				// this is as good as being written
    return onlyOpUse(invn,op,trial); // Test if varnode is only used in op
  }
  
  const PcodeOp *def = invn->getDef();
  switch(def->code()) {
  case CPUI_INDIRECT:
    // An indirectCreation is an indication of an output trial, this should not count as
    // as an "only use"
    if (def->isIndirectCreation())
      return false;
    // fallthru
  case CPUI_MULTIEQUAL:
				// Check if there is any ancestor whose only
				// use is in this op
    for(i=0;i<def->numInput();++i)
      if (ancestorOpUse(maxlevel-1,def->getIn(i),op,trial)) return true;

    return false;
  case CPUI_COPY:
    if ((invn->getSpace()->getType()==IPTR_INTERNAL)||(invn->isAddrForce())) {
				// Bit of a kludge to take into account
				// uniq <- LOAD             uniq=stackX
				//                  <->
				// call(  uniq )            call( uniq )
				// 
				// We follow copys into uniques
      if (!ancestorOpUse(maxlevel-1,def->getIn(0),op,trial)) return false;
      return true;
    }
    break;
  case CPUI_PIECE:
    // Concatenation tends to be artificial, so recurse through the least significant part
    return ancestorOpUse(maxlevel-1,def->getIn(1),op,trial);
  case CPUI_SUBPIECE:
    // This is a rather kludgy way to get around where a DIV (or other similar) instruction
    // causes a register that looks like the high precision piece of the function return
    // to be set with the remainder as a side effect
    if (def->getIn(1)->getOffset()==0) {
      const Varnode *vn = def->getIn(0);
      if (vn->isWritten()) {
	const PcodeOp *remop = vn->getDef();
	if ((remop->code()==CPUI_INT_REM)||(remop->code()==CPUI_INT_SREM))
	  trial.setRemFormed();
      }
    }
    break;
  case CPUI_CALL:
  case CPUI_CALLIND:
    return false;		// A call is never a good indication of a single op use
  default:
    break;
  }
				// This varnode must be top ancestor at this point
  return onlyOpUse(invn,op,trial); // Test if varnode is only used in op
}